

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonsugar.hpp
# Opt level: O0

shared_ptr<int> __thiscall
nonsugar::
value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
::operator()(value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  int iVar3;
  int_type iVar4;
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<int> sVar5;
  int local_1ac;
  long lStack_1a8;
  int t;
  sstream_t ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s_local;
  value_read<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_void>
  *this_local;
  
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe58,in_RDX,_Var2);
  std::istream::operator>>((istream *)&stack0xfffffffffffffe58,&local_1ac);
  bVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)&stack0xfffffffffffffe58 + *(long *)(lStack_1a8 + -0x18)));
  if (bVar1) {
    iVar3 = std::istream::peek();
    iVar4 = std::char_traits<char>::eof();
    if (iVar3 == iVar4) {
      detail::copy_shared<int>((int *)this);
      goto LAB_00175ccb;
    }
  }
  std::shared_ptr<int>::shared_ptr((shared_ptr<int> *)this,(nullptr_t)0x0);
LAB_00175ccb:
  std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffe58);
  sVar5.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar5.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<int>)sVar5.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> operator()(String const &s) const
    {
        using sstream_t = detail::sstream<String>;
        sstream_t ss(s);
        T t;
        ss >> t;
        return ss && ss.peek() == sstream_t::traits_type::eof() ?
            detail::copy_shared(t) : nullptr;
    }